

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

PlotData * __thiscall gnuplotio::PlotData::file(PlotData *this,string *fn)

{
  char *pcVar1;
  undefined1 local_230 [8];
  fstream fh;
  ostream local_220;
  _Ios_Openmode local_1c;
  string *psStack_18;
  openmode mode;
  string *fn_local;
  PlotData *this_local;
  
  psStack_18 = fn;
  fn_local = &this->plotspec;
  std::__cxx11::string::operator=((string *)&this->filename,(string *)fn);
  this->is_inline = false;
  local_1c = _S_out;
  if ((this->is_text & 1U) == 0) {
    std::operator|=(&local_1c,_S_bin);
  }
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::fstream::fstream(local_230,pcVar1,local_1c);
  std::operator<<(&local_220,(string *)&this->data);
  std::fstream::close();
  std::fstream::~fstream(local_230);
  return this;
}

Assistant:

PlotData &file(const std::string &fn) {
        filename = fn;
        is_inline = false;

        std::ios_base::openmode mode = std::fstream::out;
        if(!is_text) mode |= std::fstream::binary;
        std::fstream fh(filename.c_str(), mode);
        fh << data;
        fh.close();

        return *this;
    }